

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int64_t iVar1;
  int *piVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  uint uVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  undefined1 (*ptr) [16];
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar21;
  int64_t iVar22;
  int64_t iVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 local_240 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  long local_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  undefined1 local_180 [32];
  ulong local_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  long local_140;
  long lStack_138;
  long lStack_130;
  long lStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  long local_c0;
  long lStack_b8;
  long lStack_b0;
  long lStack_a8;
  undefined1 local_a0 [32];
  ulong local_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  int64_t iVar20;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_avx2_256_64_cold_7();
  }
  else {
    uVar17 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_diag_avx2_256_64_cold_6();
    }
    else if (open < 0) {
      parasail_sw_diag_avx2_256_64_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_diag_avx2_256_64_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_diag_avx2_256_64_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_diag_avx2_256_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_diag_avx2_256_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      iVar10 = matrix->min;
      uVar14 = 0x8000000000000000 - (long)iVar10;
      if (iVar10 != -open && SBORROW4(iVar10,-open) == iVar10 + open < 0) {
        uVar14 = (ulong)(uint)open | 0x8000000000000000;
      }
      lVar16 = uVar14 + 1;
      iVar10 = matrix->max;
      local_100._8_8_ = lVar16;
      local_100._0_8_ = lVar16;
      local_100._16_8_ = lVar16;
      local_100._24_8_ = lVar16;
      local_1c0._8_8_ = lVar16;
      local_1c0._0_8_ = lVar16;
      local_1c0._16_8_ = lVar16;
      local_1c0._24_8_ = lVar16;
      local_120._8_8_ = lVar16;
      local_120._0_8_ = lVar16;
      local_120._16_8_ = lVar16;
      local_120._24_8_ = lVar16;
      auVar25 = in_ZMM5._0_16_;
      local_140 = lVar16;
      lStack_138 = lVar16;
      lStack_130 = lVar16;
      lStack_128 = lVar16;
      ppVar11 = parasail_result_new();
      if (ppVar11 != (parasail_result_t *)0x0) {
        local_180._0_4_ = gap;
        ppVar11->flag = ppVar11->flag | 0x4801004;
        uVar14 = (ulong)(s2Len + 6);
        local_160 = (ulong)(uint)open;
        ptr = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar14);
        ptr_00 = parasail_memalign_int64_t(0x20,uVar14);
        ptr_01 = parasail_memalign_int64_t(0x20,uVar14);
        if (ptr_01 != (int64_t *)0x0 &&
            (ptr_00 != (int64_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          lVar15 = (long)_s1Len;
          if (matrix->type == 0) {
            iVar13 = _s1Len + 3;
            ptr_02 = parasail_memalign_int64_t(0x20,(long)iVar13);
            if (ptr_02 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar2 = matrix->mapper;
              lVar12 = 0;
              do {
                ptr_02[lVar12] = (long)piVar2[(byte)_s1[lVar12]];
                lVar12 = lVar12 + 1;
              } while (lVar15 != lVar12);
            }
            iVar8 = _s1Len + 1U;
            if ((int)(_s1Len + 1U) < iVar13) {
              iVar8 = iVar13;
            }
            memset(ptr_02 + lVar15,0,(ulong)(uint)(~_s1Len + iVar8) * 8 + 8);
          }
          else {
            ptr_02 = (int64_t *)0x0;
          }
          uVar18 = s2Len + 3;
          local_1a0 = 0x7ffffffffffffffe - (long)iVar10;
          auVar31._8_8_ = lStack_138;
          auVar31._0_8_ = local_140;
          auVar31._16_8_ = lStack_130;
          auVar31._24_8_ = lStack_128;
          local_a0 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar31,0x3f);
          uStack_158 = local_160;
          uStack_150 = local_160;
          uStack_148 = local_160;
          local_180._4_4_ = 0;
          local_180._8_4_ = local_180._0_4_;
          local_180._12_4_ = 0;
          local_180._16_4_ = local_180._0_4_;
          local_180._20_4_ = 0;
          local_180._24_4_ = local_180._0_4_;
          local_180._28_4_ = 0;
          piVar2 = matrix->mapper;
          uVar14 = 0;
          do {
            *(long *)(ptr[1] + uVar14 * 8 + 8) = (long)piVar2[(byte)_s2[uVar14]];
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
          *ptr = (undefined1  [16])0x0;
          *(undefined8 *)ptr[1] = 0;
          uVar9 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar18) {
            uVar9 = uVar18;
          }
          uVar14 = 0;
          auVar31 = ZEXT1632(auVar25);
          lStack_198 = local_1a0;
          lStack_190 = local_1a0;
          lStack_188 = local_1a0;
          local_c0 = lVar15;
          lStack_b8 = lVar15;
          lStack_b0 = lVar15;
          lStack_a8 = lVar15;
          local_80 = uVar17;
          uStack_78 = uVar17;
          uStack_70 = uVar17;
          uStack_68 = uVar17;
          memset(ptr[1] + uVar17 * 8 + 8,0,(ulong)(~s2Len + uVar9) * 8 + 8);
          do {
            ptr_00[uVar14 + 3] = 0;
            ptr_01[uVar14 + 3] = lVar16;
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
          lVar12 = 0;
          do {
            ptr_00[lVar12] = lVar16;
            ptr_01[lVar12] = lVar16;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          lVar12 = uVar17 + 3;
          local_100._8_8_ = lStack_138;
          local_100._0_8_ = local_140;
          local_100._16_8_ = lStack_130;
          local_100._24_8_ = lStack_128;
          auVar39 = ZEXT3264(local_100);
          do {
            ptr_00[lVar12] = lVar16;
            ptr_01[lVar12] = lVar16;
            lVar12 = lVar12 + 1;
            uVar9 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar9;
          } while ((int)uVar9 < (int)uVar18);
          local_200._8_8_ = lStack_198;
          local_200._0_8_ = local_1a0;
          local_200._16_8_ = lStack_190;
          local_200._24_8_ = lStack_188;
          local_120 = local_100;
          local_1c0 = local_100;
          auVar38 = local_100;
          local_1e0 = local_100;
          if (0 < _s1Len) {
            piVar2 = matrix->matrix;
            lVar12 = (long)matrix->size;
            iVar10 = matrix->type;
            uVar9 = _s1Len - 1;
            uVar17 = 1;
            if (1 < (int)uVar18) {
              uVar17 = (ulong)uVar18;
            }
            local_240._8_8_ = 2;
            local_240._0_8_ = 3;
            local_240._16_8_ = 1;
            local_240._24_8_ = 0;
            uVar14 = 0;
            auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
            auVar32 = ZEXT3264(auVar31);
            local_e0 = 4;
            uStack_d8 = 4;
            uStack_d0 = 4;
            uStack_c8 = 4;
            auVar30 = ZEXT3264(local_100);
            auVar29 = ZEXT3264(local_100);
            auVar28 = ZEXT3264(local_100);
            do {
              if (iVar10 == 0) {
                uVar21 = ptr_02[uVar14];
                iVar20 = ptr_02[uVar14 + 1];
                iVar22 = ptr_02[uVar14 | 2];
                iVar23 = ptr_02[uVar14 + 3];
              }
              else {
                uVar18 = (uint)uVar14;
                uVar19 = uVar18 | 1;
                if (lVar15 <= (long)(uVar14 | 1)) {
                  uVar19 = uVar9;
                }
                iVar20 = (int64_t)(int)uVar19;
                uVar19 = uVar18 | 2;
                if (lVar15 <= (long)(uVar14 | 2)) {
                  uVar19 = uVar9;
                }
                iVar22 = (int64_t)(int)uVar19;
                uVar18 = uVar18 | 3;
                if (lVar15 <= (long)(uVar14 | 3)) {
                  uVar18 = uVar9;
                }
                iVar23 = (int64_t)(int)uVar18;
                uVar21 = uVar14;
              }
              auVar37._8_8_ = lStack_b8;
              auVar37._0_8_ = local_c0;
              auVar37._16_8_ = lStack_b0;
              auVar37._24_8_ = lStack_a8;
              auVar3 = vpcmpgtq_avx2(auVar37,local_240);
              uVar24 = 0;
              auVar5 = vpmovsxbq_avx2(ZEXT416(0xfffefd));
              auVar37 = auVar39._0_32_;
              auVar33 = local_a0;
              auVar6 = local_a0;
              auVar31 = auVar37;
              do {
                auVar38 = vpermq_avx2(auVar6,0xf9);
                iVar1 = ptr_00[uVar24 + 3];
                auVar40._8_8_ = iVar1;
                auVar40._0_8_ = iVar1;
                auVar40._16_8_ = iVar1;
                auVar40._24_8_ = iVar1;
                auVar40 = vpblendd_avx2(auVar38,auVar40,0xc0);
                auVar31 = vpermq_avx2(auVar31,0xf9);
                iVar1 = ptr_01[uVar24 + 3];
                auVar41._8_8_ = iVar1;
                auVar41._0_8_ = iVar1;
                auVar41._16_8_ = iVar1;
                auVar41._24_8_ = iVar1;
                auVar31 = vpblendd_avx2(auVar31,auVar41,0xc0);
                auVar4._8_8_ = uStack_158;
                auVar4._0_8_ = local_160;
                auVar4._16_8_ = uStack_150;
                auVar4._24_8_ = uStack_148;
                auVar38 = vpsubq_avx2(auVar40,auVar4);
                auVar26 = vpsubq_avx2(auVar31,local_180);
                auVar6 = vpsubq_avx2(auVar6,auVar4);
                auVar37 = vpsubq_avx2(auVar37,local_180);
                auVar25._8_8_ = 0;
                auVar25._0_8_ = (long)piVar2[iVar20 * lVar12 + *(long *)(ptr[1] + uVar24 * 8)];
                auVar34._8_8_ = 0;
                auVar34._0_8_ = (long)piVar2[uVar21 * lVar12 + *(long *)(ptr[1] + uVar24 * 8 + 8)];
                auVar25 = vpunpcklqdq_avx(auVar25,auVar34);
                auVar27._8_8_ = 0;
                auVar27._0_8_ = (long)piVar2[iVar23 * lVar12 + *(long *)(*ptr + uVar24 * 8)];
                auVar35._8_8_ = 0;
                auVar35._0_8_ = (long)piVar2[iVar22 * lVar12 + *(long *)(*ptr + uVar24 * 8 + 8)];
                auVar27 = vpunpcklqdq_avx(auVar27,auVar35);
                auVar31 = vpcmpgtq_avx2(auVar38,auVar26);
                auVar31 = vblendvpd_avx(auVar26,auVar38,auVar31);
                auVar26._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar27;
                auVar26._16_16_ = ZEXT116(1) * auVar25;
                auVar38 = vpcmpgtq_avx2(auVar6,auVar37);
                auVar37 = vblendvpd_avx(auVar37,auVar6,auVar38);
                auVar38 = vpaddq_avx2(auVar33,auVar26);
                auVar6 = vpcmpgtq_avx2(auVar38,auVar37);
                auVar38 = vblendvpd_avx(auVar37,auVar38,auVar6);
                auVar6 = vpcmpgtq_avx2(auVar38,auVar31);
                auVar38 = vblendvpd_avx(auVar31,auVar38,auVar6);
                auVar6 = vpcmpgtq_avx2(auVar38,_DAT_00908c40);
                auVar38 = vpand_avx2(auVar6,auVar38);
                auVar33._0_8_ = -(ulong)(auVar5._0_8_ == auVar32._0_8_);
                auVar33._8_8_ = -(ulong)(auVar5._8_8_ == auVar32._8_8_);
                auVar33._16_8_ = -(ulong)(auVar5._16_8_ == auVar32._16_8_);
                auVar33._24_8_ = -(ulong)(auVar5._24_8_ == auVar32._24_8_);
                auVar6 = vpandn_avx2(auVar33,auVar38);
                auVar31 = vblendvpd_avx(auVar31,auVar39._0_32_,auVar33);
                if (3 < uVar24) {
                  auVar26 = vpcmpgtq_avx2(auVar6,local_200);
                  local_200 = vblendvpd_avx(auVar6,local_200,auVar26);
                  auVar26 = vpcmpgtq_avx2(local_1e0,auVar6);
                  local_1e0 = vblendvpd_avx(auVar6,local_1e0,auVar26);
                }
                auVar4 = vpcmpgtq_avx2(auVar5,auVar32._0_32_);
                auVar7._8_8_ = uStack_78;
                auVar7._0_8_ = local_80;
                auVar7._16_8_ = uStack_70;
                auVar7._24_8_ = uStack_68;
                auVar26 = vpcmpgtq_avx2(auVar7,auVar5);
                auVar26 = vpand_avx2(auVar3,auVar26);
                auVar26 = vpand_avx2(auVar26,auVar4);
                auVar25 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
                auVar36._0_8_ = -(ulong)(auVar6._0_8_ == auVar30._0_8_);
                auVar36._8_8_ = -(ulong)(auVar6._8_8_ == auVar30._8_8_);
                auVar36._16_8_ = -(ulong)(auVar6._16_8_ == auVar30._16_8_);
                auVar36._24_8_ = -(ulong)(auVar6._24_8_ == auVar30._24_8_);
                auVar41 = vpcmpgtq_avx2(auVar6,auVar30._0_32_);
                auVar4 = vpand_avx2(auVar41,auVar26);
                local_100 = vblendvpd_avx(auVar30._0_32_,auVar38,auVar4);
                auVar30 = ZEXT3264(local_100);
                auVar27 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
                auVar38 = vpcmpgtq_avx2(auVar29._0_32_,auVar5);
                auVar4 = vpand_avx2(auVar38,auVar36);
                auVar34 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
                auVar25 = vblendvps_avx(auVar27,auVar25,auVar34);
                auVar38._8_8_ = lStack_138;
                auVar38._0_8_ = local_140;
                auVar38._16_8_ = lStack_130;
                auVar38._24_8_ = lStack_128;
                auVar39 = ZEXT3264(auVar38);
                auVar37 = vblendvpd_avx(auVar37,auVar38,auVar33);
                auVar33 = vpmovsxdq_avx2(auVar25);
                local_1c0 = vblendvpd_avx(auVar28._0_32_,local_240,auVar33);
                auVar28 = ZEXT3264(local_1c0);
                auVar33 = vpor_avx2(auVar4,auVar41);
                auVar4 = vpcmpeqd_avx2(auVar41,auVar41);
                auVar32 = ZEXT3264(auVar4);
                auVar33 = vpand_avx2(auVar26,auVar33);
                local_120 = vblendvpd_avx(auVar29._0_32_,auVar5,auVar33);
                auVar29 = ZEXT3264(local_120);
                ptr_00[uVar24] = auVar6._0_8_;
                iVar1 = vmovlpd_avx(auVar31._0_16_);
                ptr_01[uVar24] = iVar1;
                auVar5 = vpsubq_avx2(auVar5,auVar4);
                uVar24 = uVar24 + 1;
                auVar33 = auVar40;
              } while (uVar17 != uVar24);
              auVar6._8_8_ = 4;
              auVar6._0_8_ = 4;
              auVar6._16_8_ = 4;
              auVar6._24_8_ = 4;
              local_240 = vpaddq_avx2(local_240,auVar6);
              uVar14 = uVar14 + 4;
            } while ((long)uVar14 < lVar15);
          }
          lVar15 = 0;
          iVar10 = 0;
          iVar13 = 0;
          do {
            lVar12 = *(long *)(local_100 + lVar15 * 8);
            if (lVar16 < lVar12) {
              iVar10 = *(int *)(local_1c0 + lVar15 * 8);
              lVar16 = lVar12;
              iVar13 = *(int *)(local_120 + lVar15 * 8);
            }
            else if (lVar12 == lVar16) {
              lVar12 = *(long *)(local_120 + lVar15 * 8);
              if (lVar12 < iVar13) {
                iVar10 = *(int *)(local_1c0 + lVar15 * 8);
                iVar13 = (int)lVar12;
              }
              else if ((lVar12 == iVar13) && (*(long *)(local_1c0 + lVar15 * 8) < (long)iVar10)) {
                iVar10 = (int)*(long *)(local_1c0 + lVar15 * 8);
                iVar13 = (int)lVar12;
              }
            }
            lVar15 = lVar15 + 1;
          } while ((int)lVar15 != 4);
          auVar31 = vpcmpgtq_avx2(auVar38,local_200);
          auVar3._8_8_ = lStack_198;
          auVar3._0_8_ = local_1a0;
          auVar3._16_8_ = lStack_190;
          auVar3._24_8_ = lStack_188;
          auVar38 = vpcmpgtq_avx2(local_1e0,auVar3);
          auVar31 = vpor_avx2(auVar31,auVar38);
          if ((((auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               SUB321(auVar31 >> 0x7f,0) != '\0') || SUB321(auVar31 >> 0xbf,0) != '\0') ||
              auVar31[0x1f] < '\0') {
            *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
            lVar16 = 0;
            iVar13 = 0;
            iVar10 = 0;
          }
          ppVar11->score = (int)lVar16;
          ppVar11->end_query = iVar10;
          ppVar11->end_ref = iVar13;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar11;
          }
          return ppVar11;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vNH, vOpen),
                    _mm256_sub_epi64(vF, vGap));
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vWH, vOpen),
                    _mm256_sub_epi64(vE, vGap));
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}